

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int isSetNullAction(Parse *pParse,FKey *pFKey)

{
  Trigger *pTVar1;
  Parse *local_38;
  Trigger *p;
  Parse *pTop;
  FKey *pFKey_local;
  Parse *pParse_local;
  
  local_38 = pParse;
  if (pParse->pToplevel != (Parse *)0x0) {
    local_38 = pParse->pToplevel;
  }
  if ((local_38->pTriggerPrg == (TriggerPrg *)0x0) ||
     (((pTVar1 = local_38->pTriggerPrg->pTrigger, pTVar1 != pFKey->apTrigger[0] ||
       (pFKey->aAction[0] != '\b')) &&
      ((pTVar1 != pFKey->apTrigger[1] || (pFKey->aAction[1] != '\b')))))) {
    pParse_local._4_4_ = 0;
  }
  else {
    pParse_local._4_4_ = 1;
  }
  return pParse_local._4_4_;
}

Assistant:

static int isSetNullAction(Parse *pParse, FKey *pFKey){
  Parse *pTop = sqlite3ParseToplevel(pParse);
  if( pTop->pTriggerPrg ){
    Trigger *p = pTop->pTriggerPrg->pTrigger;
    if( (p==pFKey->apTrigger[0] && pFKey->aAction[0]==OE_SetNull)
     || (p==pFKey->apTrigger[1] && pFKey->aAction[1]==OE_SetNull)
    ){
      return 1;
    }
  }
  return 0;
}